

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_jpgd.cpp
# Opt level: O2

void __thiscall jpgd::jpeg_decoder::transform_mcu_expand(jpeg_decoder *this,int mcu_row)

{
  char cVar1;
  int iVar2;
  uint8 *puVar3;
  int *piVar4;
  jpgd_block_t *pSrc;
  long lVar5;
  Matrix44 S;
  Matrix44 Q;
  Matrix44 R;
  Matrix44 P;
  Matrix44 c;
  Matrix44 a;
  jpgd_block_t temp_block [64];
  Matrix44 local_238;
  Matrix44 local_1f8;
  Matrix44 local_1b8;
  Matrix44 local_178;
  Matrix44 local_138;
  Matrix44 local_f8;
  jpgd_block_t local_b8 [68];
  
  pSrc = this->m_pMCU_coefficients;
  piVar4 = this->m_mcu_block_max_zag;
  puVar3 = this->m_pSample_buf + (long)(mcu_row * this->m_expanded_blocks_per_mcu * 0x40) + 0xc0;
  for (lVar5 = 0; lVar5 < this->m_expanded_blocks_per_component; lVar5 = lVar5 + 1) {
    jpgd::idct(pSrc,puVar3 + -0xc0,*piVar4);
    pSrc = pSrc + 0x40;
    piVar4 = piVar4 + 1;
    puVar3 = puVar3 + 0x40;
  }
  for (lVar5 = 0; lVar5 != 0x200; lVar5 = lVar5 + 0x100) {
    iVar2 = *piVar4 + -1;
    if (*piVar4 < 2) {
      iVar2 = 0;
    }
    cVar1 = (&s_max_rc)[iVar2];
    if (cVar1 == -0x78) {
      DCT_Upsample::P_Q<8,_8>::calc(&local_178,&local_1f8,pSrc);
      DCT_Upsample::R_S<8,_8>::calc(&local_1b8,&local_238,pSrc);
    }
    else if (cVar1 == '\x12') {
      DCT_Upsample::P_Q<1,_2>::calc(&local_178,&local_1f8,pSrc);
      DCT_Upsample::R_S<1,_2>::calc(&local_1b8,&local_238,pSrc);
    }
    else if (cVar1 == '\"') {
      DCT_Upsample::P_Q<2,_2>::calc(&local_178,&local_1f8,pSrc);
      DCT_Upsample::R_S<2,_2>::calc(&local_1b8,&local_238,pSrc);
    }
    else if (cVar1 == '2') {
      DCT_Upsample::P_Q<3,_2>::calc(&local_178,&local_1f8,pSrc);
      DCT_Upsample::R_S<3,_2>::calc(&local_1b8,&local_238,pSrc);
    }
    else if (cVar1 == '3') {
      DCT_Upsample::P_Q<3,_3>::calc(&local_178,&local_1f8,pSrc);
      DCT_Upsample::R_S<3,_3>::calc(&local_1b8,&local_238,pSrc);
    }
    else if (cVar1 == '4') {
      DCT_Upsample::P_Q<3,_4>::calc(&local_178,&local_1f8,pSrc);
      DCT_Upsample::R_S<3,_4>::calc(&local_1b8,&local_238,pSrc);
    }
    else if (cVar1 == 'D') {
      DCT_Upsample::P_Q<4,_4>::calc(&local_178,&local_1f8,pSrc);
      DCT_Upsample::R_S<4,_4>::calc(&local_1b8,&local_238,pSrc);
    }
    else if (cVar1 == 'T') {
      DCT_Upsample::P_Q<5,_4>::calc(&local_178,&local_1f8,pSrc);
      DCT_Upsample::R_S<5,_4>::calc(&local_1b8,&local_238,pSrc);
    }
    else if (cVar1 == 'U') {
      DCT_Upsample::P_Q<5,_5>::calc(&local_178,&local_1f8,pSrc);
      DCT_Upsample::R_S<5,_5>::calc(&local_1b8,&local_238,pSrc);
    }
    else if (cVar1 == 'V') {
      DCT_Upsample::P_Q<5,_6>::calc(&local_178,&local_1f8,pSrc);
      DCT_Upsample::R_S<5,_6>::calc(&local_1b8,&local_238,pSrc);
    }
    else if (cVar1 == 'f') {
      DCT_Upsample::P_Q<6,_6>::calc(&local_178,&local_1f8,pSrc);
      DCT_Upsample::R_S<6,_6>::calc(&local_1b8,&local_238,pSrc);
    }
    else if (cVar1 == 'v') {
      DCT_Upsample::P_Q<7,_6>::calc(&local_178,&local_1f8,pSrc);
      DCT_Upsample::R_S<7,_6>::calc(&local_1b8,&local_238,pSrc);
    }
    else if (cVar1 == 'w') {
      DCT_Upsample::P_Q<7,_7>::calc(&local_178,&local_1f8,pSrc);
      DCT_Upsample::R_S<7,_7>::calc(&local_1b8,&local_238,pSrc);
    }
    else if (cVar1 == 'x') {
      DCT_Upsample::P_Q<7,_8>::calc(&local_178,&local_1f8,pSrc);
      DCT_Upsample::R_S<7,_8>::calc(&local_1b8,&local_238,pSrc);
    }
    else if (cVar1 == '\x11') {
      local_178.v[0][0] = (Element_Type)*pSrc;
      local_178.v[3][1] = 0;
      local_178.v[3][2] = 0;
      local_178.v[3][3] = 0;
      local_178.v[2][1] = 0;
      local_178.v[2][2] = 0;
      local_178.v[2][3] = 0;
      local_178.v[3][0] = 0;
      local_178.v[1][1] = 0;
      local_178.v[1][2] = 0;
      local_178.v[1][3] = 0;
      local_178.v[2][0] = 0;
      local_178.v[0][1] = 0;
      local_178.v[0][2] = 0;
      local_178.v[0][3] = 0;
      local_178.v[1][0] = 0;
      local_1f8.v[3][0] = 0;
      local_1f8.v[3][1] = 0;
      local_1f8.v[3][2] = 0;
      local_1f8.v[3][3] = 0;
      local_1f8.v[2][0] = 0;
      local_1f8.v[2][1] = 0;
      local_1f8.v[2][2] = 0;
      local_1f8.v[2][3] = 0;
      local_1f8.v[1][0] = 0;
      local_1f8.v[1][1] = 0;
      local_1f8.v[1][2] = 0;
      local_1f8.v[1][3] = 0;
      local_1f8.v[0][0] = 0;
      local_1f8.v[0][1] = 0;
      local_1f8.v[0][2] = 0;
      local_1f8.v[0][3] = 0;
      local_1b8.v[0][0] = 0;
      local_1b8.v[0][1] = 0;
      local_1b8.v[0][2] = 0;
      local_1b8.v[0][3] = 0;
      local_1b8.v[1][0] = 0;
      local_1b8.v[1][1] = 0;
      local_1b8.v[1][2] = 0;
      local_1b8.v[1][3] = 0;
      local_1b8.v[2][0] = 0;
      local_1b8.v[2][1] = 0;
      local_1b8.v[2][2] = 0;
      local_1b8.v[2][3] = 0;
      local_1b8.v[3][0] = 0;
      local_1b8.v[3][1] = 0;
      local_1b8.v[3][2] = 0;
      local_1b8.v[3][3] = 0;
      local_238.v[0][0] = 0;
      local_238.v[0][1] = 0;
      local_238.v[0][2] = 0;
      local_238.v[0][3] = 0;
      local_238.v[1][0] = 0;
      local_238.v[1][1] = 0;
      local_238.v[1][2] = 0;
      local_238.v[1][3] = 0;
      local_238.v[2][0] = 0;
      local_238.v[2][1] = 0;
      local_238.v[2][2] = 0;
      local_238.v[2][3] = 0;
      local_238.v[3][0] = 0;
      local_238.v[3][1] = 0;
      local_238.v[3][2] = 0;
      local_238.v[3][3] = 0;
    }
    DCT_Upsample::operator+(&local_178,&local_1f8);
    DCT_Upsample::Matrix44::operator-=(&local_178,&local_1f8);
    DCT_Upsample::operator+(&local_1b8,&local_238);
    DCT_Upsample::Matrix44::operator-=(&local_1b8,&local_238);
    DCT_Upsample::Matrix44::add_and_store(local_b8,&local_f8,&local_138);
    idct_4x4(local_b8,puVar3 + lVar5 + -0xc0);
    DCT_Upsample::Matrix44::sub_and_store(local_b8,&local_f8,&local_138);
    idct_4x4(local_b8,puVar3 + lVar5 + -0x80);
    DCT_Upsample::Matrix44::add_and_store(local_b8,&local_178,&local_1b8);
    idct_4x4(local_b8,puVar3 + lVar5 + -0x40);
    DCT_Upsample::Matrix44::sub_and_store(local_b8,&local_178,&local_1b8);
    idct_4x4(local_b8,puVar3 + lVar5);
    pSrc = pSrc + 0x40;
    piVar4 = piVar4 + 1;
  }
  return;
}

Assistant:

void jpeg_decoder::transform_mcu_expand(int mcu_row) {
  jpgd_block_t* pSrc_ptr = m_pMCU_coefficients;
  uint8* pDst_ptr = m_pSample_buf + mcu_row * m_expanded_blocks_per_mcu * 64;

  // Y IDCT
  int mcu_block;
  for (mcu_block = 0; mcu_block < m_expanded_blocks_per_component; mcu_block++) {
    idct(pSrc_ptr, pDst_ptr, m_mcu_block_max_zag[mcu_block]);
    pSrc_ptr += 64;
    pDst_ptr += 64;
  }

  // Chroma IDCT, with upsampling
  jpgd_block_t temp_block[64];

  for (int i = 0; i < 2; i++) {
    DCT_Upsample::Matrix44 P, Q, R, S;

    JPGD_ASSERT(m_mcu_block_max_zag[mcu_block] >= 1);
    JPGD_ASSERT(m_mcu_block_max_zag[mcu_block] <= 64);

    int max_zag = m_mcu_block_max_zag[mcu_block++] - 1;
    if (max_zag <= 0)
      max_zag = 0;  // should never happen, only here to shut up static analysis
    switch (s_max_rc[max_zag]) {
      case 1 * 16 + 1:
        DCT_Upsample::P_Q<1, 1>::calc(P, Q, pSrc_ptr);
        DCT_Upsample::R_S<1, 1>::calc(R, S, pSrc_ptr);
        break;
      case 1 * 16 + 2:
        DCT_Upsample::P_Q<1, 2>::calc(P, Q, pSrc_ptr);
        DCT_Upsample::R_S<1, 2>::calc(R, S, pSrc_ptr);
        break;
      case 2 * 16 + 2:
        DCT_Upsample::P_Q<2, 2>::calc(P, Q, pSrc_ptr);
        DCT_Upsample::R_S<2, 2>::calc(R, S, pSrc_ptr);
        break;
      case 3 * 16 + 2:
        DCT_Upsample::P_Q<3, 2>::calc(P, Q, pSrc_ptr);
        DCT_Upsample::R_S<3, 2>::calc(R, S, pSrc_ptr);
        break;
      case 3 * 16 + 3:
        DCT_Upsample::P_Q<3, 3>::calc(P, Q, pSrc_ptr);
        DCT_Upsample::R_S<3, 3>::calc(R, S, pSrc_ptr);
        break;
      case 3 * 16 + 4:
        DCT_Upsample::P_Q<3, 4>::calc(P, Q, pSrc_ptr);
        DCT_Upsample::R_S<3, 4>::calc(R, S, pSrc_ptr);
        break;
      case 4 * 16 + 4:
        DCT_Upsample::P_Q<4, 4>::calc(P, Q, pSrc_ptr);
        DCT_Upsample::R_S<4, 4>::calc(R, S, pSrc_ptr);
        break;
      case 5 * 16 + 4:
        DCT_Upsample::P_Q<5, 4>::calc(P, Q, pSrc_ptr);
        DCT_Upsample::R_S<5, 4>::calc(R, S, pSrc_ptr);
        break;
      case 5 * 16 + 5:
        DCT_Upsample::P_Q<5, 5>::calc(P, Q, pSrc_ptr);
        DCT_Upsample::R_S<5, 5>::calc(R, S, pSrc_ptr);
        break;
      case 5 * 16 + 6:
        DCT_Upsample::P_Q<5, 6>::calc(P, Q, pSrc_ptr);
        DCT_Upsample::R_S<5, 6>::calc(R, S, pSrc_ptr);
        break;
      case 6 * 16 + 6:
        DCT_Upsample::P_Q<6, 6>::calc(P, Q, pSrc_ptr);
        DCT_Upsample::R_S<6, 6>::calc(R, S, pSrc_ptr);
        break;
      case 7 * 16 + 6:
        DCT_Upsample::P_Q<7, 6>::calc(P, Q, pSrc_ptr);
        DCT_Upsample::R_S<7, 6>::calc(R, S, pSrc_ptr);
        break;
      case 7 * 16 + 7:
        DCT_Upsample::P_Q<7, 7>::calc(P, Q, pSrc_ptr);
        DCT_Upsample::R_S<7, 7>::calc(R, S, pSrc_ptr);
        break;
      case 7 * 16 + 8:
        DCT_Upsample::P_Q<7, 8>::calc(P, Q, pSrc_ptr);
        DCT_Upsample::R_S<7, 8>::calc(R, S, pSrc_ptr);
        break;
      case 8 * 16 + 8:
        DCT_Upsample::P_Q<8, 8>::calc(P, Q, pSrc_ptr);
        DCT_Upsample::R_S<8, 8>::calc(R, S, pSrc_ptr);
        break;
      default:
        JPGD_ASSERT(false);
    }

    DCT_Upsample::Matrix44 a(P + Q);
    P -= Q;
    DCT_Upsample::Matrix44& b = P;
    DCT_Upsample::Matrix44 c(R + S);
    R -= S;
    DCT_Upsample::Matrix44& d = R;

    DCT_Upsample::Matrix44::add_and_store(temp_block, a, c);
    idct_4x4(temp_block, pDst_ptr);
    pDst_ptr += 64;

    DCT_Upsample::Matrix44::sub_and_store(temp_block, a, c);
    idct_4x4(temp_block, pDst_ptr);
    pDst_ptr += 64;

    DCT_Upsample::Matrix44::add_and_store(temp_block, b, d);
    idct_4x4(temp_block, pDst_ptr);
    pDst_ptr += 64;

    DCT_Upsample::Matrix44::sub_and_store(temp_block, b, d);
    idct_4x4(temp_block, pDst_ptr);
    pDst_ptr += 64;

    pSrc_ptr += 64;
  }
}